

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall cppcms::application::~application(application *this)

{
  hold_ptr<cppcms::application::_data> *this_00;
  uint uVar1;
  pointer ppaVar2;
  ulong uVar3;
  
  this->_vptr_application = (_func_int **)&PTR__application_002b3c18;
  this_00 = &this->d;
  uVar1 = 0;
  while( true ) {
    uVar3 = (ulong)uVar1;
    ppaVar2 = (this_00->ptr_->managed_children).
              super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this_00->ptr_->managed_children).
                      super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppaVar2 >> 3) <= uVar3)
    break;
    if (ppaVar2[uVar3] != (application *)0x0) {
      (*ppaVar2[uVar3]->_vptr_application[1])();
      ppaVar2 = (this_00->ptr_->managed_children).
                super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    ppaVar2[uVar3] = (application *)0x0;
    uVar1 = uVar1 + 1;
  }
  booster::atomic_counter::~atomic_counter(&this->refs_);
  booster::hold_ptr<cppcms::application::_data>::~hold_ptr(this_00);
  return;
}

Assistant:

application::~application()
{
	for(unsigned i=0;i<d->managed_children.size();i++) {
		delete d->managed_children[i];
		d->managed_children[i]=0;
	}
}